

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t linear_hash_close(linear_hash_table_t *linear_hash)

{
  ion_err_t iVar1;
  int iVar2;
  array_list_t *__ptr;
  
  iVar2 = fclose((FILE *)linear_hash->state);
  if (iVar2 == 0) {
    __ptr = linear_hash->bucket_map;
    if (__ptr->data != (ion_fpos_t *)0x0) {
      free(__ptr->data);
      __ptr = linear_hash->bucket_map;
      __ptr->data = (ion_fpos_t *)0x0;
    }
    free(__ptr);
    linear_hash->bucket_map = (array_list_t *)0x0;
    iVar2 = fclose((FILE *)linear_hash->database);
    iVar1 = '\n';
    if (iVar2 == 0) {
      if (linear_hash->cache != (ion_byte_t *)0x0) {
        free(linear_hash->cache);
        linear_hash->bucket_map = (array_list_t *)0x0;
      }
      linear_hash->database = (FILE *)0x0;
      linear_hash->state = (FILE *)0x0;
      iVar1 = '\0';
    }
  }
  else {
    linear_hash_write_state(linear_hash);
    iVar1 = '\n';
  }
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_close(
	linear_hash_table_t *linear_hash
) {
	if (0 != fclose(linear_hash->state)) {
		linear_hash_write_state(linear_hash);
		return err_file_close_error;
	}

	if (linear_hash->bucket_map->data != NULL) {
		free(linear_hash->bucket_map->data);
		linear_hash->bucket_map->data = NULL;
	}

	if (linear_hash->bucket_map != NULL) {
		free(linear_hash->bucket_map);
		linear_hash->bucket_map = NULL;
	}

	if (0 != fclose(linear_hash->database)) {
		return err_file_close_error;
	}

	if (linear_hash->cache != NULL) {
		free(linear_hash->cache);
		linear_hash->bucket_map = NULL;
	}

	linear_hash->database	= NULL;

	linear_hash->state		= NULL;

	return err_ok;
}